

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

SUNErrCode
N_VLinearSumVectorArray_ManyVector
          (int nvec,sunrealtype a,N_Vector *X,sunrealtype b,N_Vector *Y,N_Vector *Z)

{
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  N_Vector *Zsub;
  N_Vector *Ysub;
  N_Vector *Xsub;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  long local_48;
  long local_40;
  
  __ptr = malloc((long)in_EDI << 3);
  __ptr_00 = malloc((long)in_EDI << 3);
  __ptr_01 = malloc((long)in_EDI << 3);
  for (local_40 = 0; local_40 < **(long **)*in_RSI; local_40 = local_40 + 1) {
    for (local_48 = 0; local_48 < in_EDI; local_48 = local_48 + 1) {
      *(undefined8 *)((long)__ptr + local_48 * 8) =
           *(undefined8 *)(*(long *)(*(long *)in_RSI[local_48] + 0x10) + local_40 * 8);
      *(undefined8 *)((long)__ptr_00 + local_48 * 8) =
           *(undefined8 *)(*(long *)(**(long **)(in_RDX + local_48 * 8) + 0x10) + local_40 * 8);
      *(undefined8 *)((long)__ptr_01 + local_48 * 8) =
           *(undefined8 *)(*(long *)(**(long **)(in_RCX + local_48 * 8) + 0x10) + local_40 * 8);
    }
    N_VLinearSumVectorArray(in_XMM0_Qa,in_XMM1_Qa,in_EDI,__ptr,__ptr_00,__ptr_01);
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VLinearSumVectorArray)(int nvec, sunrealtype a,
                                             N_Vector* X, sunrealtype b,
                                             N_Vector* Y, N_Vector* Z)
{
  SUNFunctionBegin(X[0]->sunctx);
  sunindextype i, j;
  N_Vector *Xsub, *Ysub, *Zsub;

  SUNAssert(nvec > 0, SUN_ERR_ARG_OUTOFRANGE);

  /* create arrays of nvec N_Vector pointers for reuse within loop */
  Xsub = NULL;
  Ysub = NULL;
  Zsub = NULL;
  Xsub = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Xsub, SUN_ERR_MALLOC_FAIL);
  Ysub = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Ysub, SUN_ERR_MALLOC_FAIL);
  Zsub = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Zsub, SUN_ERR_MALLOC_FAIL);

  /* perform operation by calling N_VLinearSumVectorArray for each subvector */
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(X[0]); i++)
  {
    /* for each subvector, create the array of subvectors of X, Y and Z */
    for (j = 0; j < nvec; j++)
    {
      Xsub[j] = MANYVECTOR_SUBVEC(X[j], i);
      Ysub[j] = MANYVECTOR_SUBVEC(Y[j], i);
      Zsub[j] = MANYVECTOR_SUBVEC(Z[j], i);
    }

    /* now call N_VLinearSumVectorArray for this array of subvectors */
    SUNCheckCall(N_VLinearSumVectorArray(nvec, a, Xsub, b, Ysub, Zsub));
  }

  /* clean up and return */
  free(Xsub);
  free(Ysub);
  free(Zsub);
  return SUN_SUCCESS;
}